

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_writer.cpp
# Opt level: O0

void __thiscall VM_Writer::write_label(VM_Writer *this,int label_number)

{
  ostream *poVar1;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  VM_Writer *pVStack_10;
  int label_number_local;
  VM_Writer *this_local;
  
  poVar1 = (ostream *)this->out_file;
  local_14 = label_number;
  pVStack_10 = this;
  std::__cxx11::to_string(&local_58,label_number);
  std::operator+(&local_38,"label L",&local_58);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void VM_Writer::write_label(int label_number) {
    out_file <<"label L" + std::to_string(label_number) << std::endl;
}